

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_move_grow.cpp
# Opt level: O2

long Am_Clip_And_Map(long val,long val_1,long val_2,long target_val_1,long target_val_2)

{
  long lVar1;
  
  lVar1 = target_val_1;
  if (val_2 == val_1) {
    if (val_1 <= val) {
      lVar1 = target_val_2;
    }
  }
  else if (((val_1 <= val || val_2 <= val_1) &&
           (lVar1 = target_val_2, val_2 <= val_1 || val <= val_2)) &&
          (lVar1 = target_val_2, val_2 <= val || val_1 <= val_2)) {
    lVar1 = target_val_1;
    if ((val - val_1 == 0 || val < val_1) || val_1 <= val_2) {
      lVar1 = target_val_1 + ((target_val_2 - target_val_1) * (val - val_1)) / (val_2 - val_1);
    }
  }
  return lVar1;
}

Assistant:

long
Am_Clip_And_Map(long val, long val_1, long val_2, long target_val_1,
                long target_val_2)
{
  if (val_1 == val_2) {
    if (val < val_1)
      return target_val_1;
    else
      return target_val_2;
  } else { // val_1 != val_2
    if (val < val_1 && val_1 < val_2)
      return target_val_1;
    else if (val_1 < val_2 && val_2 < val)
      return target_val_2;
    else if (val < val_2 && val_2 < val_1)
      return target_val_2;
    else if (val_2 < val_1 && val_1 < val)
      return target_val_1;
    //casting to long is important under Windows, else overflow!
    else
      return target_val_1 +
             (val - val_1) * (target_val_2 - target_val_1) / (val_2 - val_1);
  }
}